

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatTest_WideFormatToN_Test::TestBody(FormatTest_WideFormatToN_Test *this)

{
  range out;
  bool bVar1;
  char *pcVar2;
  basic_string_view<wchar_t> format_str;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  args;
  type it;
  AssertionResult gtest_ar;
  wchar_t buffer [4];
  type result;
  iterator local_78;
  wchar_t *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  wchar_t local_38 [3];
  wchar_t local_2c;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_28;
  size_t local_20;
  
  local_2c = L'x';
  sStack_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_48 = 0;
  out.it_.super_truncating_iterator_base<wchar_t_*>.limit_ = 3;
  out.it_.super_truncating_iterator_base<wchar_t_*>.out_ = local_38;
  out.it_.super_truncating_iterator_base<wchar_t_*>.count_ = 0;
  out.it_._24_8_ = uStack_40;
  format_str.size_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>,int>
       ::TYPES;
  format_str.data_ = (wchar_t *)0x2;
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
        *)0x0;
  args.types_ = (unsigned_long_long)&stack0xffffffffffffff78;
  local_58 = local_38;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
            (&local_78,(v5 *)0x24bb6c,out,format_str,args,(locale_ref)0x3039);
  pbStack_28 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_78.super_truncating_iterator_base<wchar_t_*>.out_;
  local_20 = local_78.super_truncating_iterator_base<wchar_t_*>.count_;
  local_78.super_truncating_iterator_base<wchar_t_*>.out_ =
       (wchar_t *)CONCAT44(local_78.super_truncating_iterator_base<wchar_t_*>.out_._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_58,"5u","result.size",(uint *)&local_78,&local_20);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (sStack_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((sStack_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x814,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff78,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff78);
    if (local_78.super_truncating_iterator_base<wchar_t_*>.out_ != (wchar_t *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.super_truncating_iterator_base<wchar_t_*>.out_ != (wchar_t *)0x0)) {
        (**(code **)(*(long *)local_78.super_truncating_iterator_base<wchar_t_*>.out_ + 8))();
      }
      local_78.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_truncating_iterator_base<wchar_t_*>.out_ = &local_2c;
  testing::internal::CmpHelperEQ<wchar_t*,wchar_t*>
            ((internal *)&local_58,"buffer + 3","result.out",(wchar_t **)&local_78,
             (wchar_t **)&pbStack_28);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (sStack_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((sStack_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x815,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff78,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff78);
    if (local_78.super_truncating_iterator_base<wchar_t_*>.out_ != (wchar_t *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.super_truncating_iterator_base<wchar_t_*>.out_ != (wchar_t *)0x0)) {
        (**(code **)(*(long *)local_78.super_truncating_iterator_base<wchar_t_*>.out_ + 8))();
      }
      local_78.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_truncating_iterator_base<wchar_t_*>.limit_ = 4;
  local_78.super_truncating_iterator_base<wchar_t_*>.out_ = local_38;
  testing::internal::CmpHelperEQ<wchar_t[5],fmt::v5::basic_string_view<wchar_t>>
            ((internal *)&local_58,"L\"123x\"","fmt::wstring_view(buffer, 4)",
             (wchar_t (*) [5])L"123x",(basic_string_view<wchar_t> *)&local_78);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (sStack_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((sStack_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x816,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff78,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff78);
    if (local_78.super_truncating_iterator_base<wchar_t_*>.out_ != (wchar_t *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.super_truncating_iterator_base<wchar_t_*>.out_ != (wchar_t *)0x0)) {
        (**(code **)(*(long *)local_78.super_truncating_iterator_base<wchar_t_*>.out_ + 8))();
      }
      local_78.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, WideFormatToN) {
  wchar_t buffer[4];
  buffer[3] = L'x';
  auto result = fmt::format_to_n(buffer, 3, L"{}", 12345);
  EXPECT_EQ(5u, result.size);
  EXPECT_EQ(buffer + 3, result.out);
  EXPECT_EQ(L"123x", fmt::wstring_view(buffer, 4));
}